

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMatrix3x3.cpp
# Opt level: O3

void __thiscall
utMatrix3x3Test_FromToMatrixTest_Test::~utMatrix3x3Test_FromToMatrixTest_Test
          (utMatrix3x3Test_FromToMatrixTest_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F( utMatrix3x3Test, FromToMatrixTest ) {
    aiVector3D res;
    aiMatrix3x3 trafo;

    const double PRECISION = 0.000001;

    // axes test
    aiVector3D axes[] =
        { aiVector3D(1, 0, 0)
        , aiVector3D(0, 1, 0)
        , aiVector3D(0, 0, 1)
        };

    for (int i = 0; i < 3; ++i) {
        for (int j = 0; j < 3; ++j) {
            aiMatrix3x3::FromToMatrix( axes[i], axes[j], trafo );
            res = trafo * axes[i];

            ASSERT_NEAR( axes[j].x, res.x, PRECISION );
            ASSERT_NEAR( axes[j].y, res.y, PRECISION );
            ASSERT_NEAR( axes[j].z, res.z, PRECISION );
        }
    }

    // random test
    const int NUM_SAMPLES = 10000;

    aiVector3D from, to;

    for (int i = 0; i < NUM_SAMPLES; ++i) {
        from = aiVector3D
            ( 1.f * rand() / RAND_MAX
            , 1.f * rand() / RAND_MAX
            , 1.f * rand() / RAND_MAX
            ).Normalize();
        to = aiVector3D
            ( 1.f * rand() / RAND_MAX
            , 1.f * rand() / RAND_MAX
            , 1.f * rand() / RAND_MAX
            ).Normalize();

        aiMatrix3x3::FromToMatrix( from, to, trafo );
        res = trafo * from;

        ASSERT_NEAR( to.x, res.x, PRECISION );
        ASSERT_NEAR( to.y, res.y, PRECISION );
        ASSERT_NEAR( to.z, res.z, PRECISION );
    }
}